

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Publication.h
# Opt level: O0

int64_t __thiscall
aeron::Publication::offer
          (Publication *this,AtomicBuffer *buffer,index_t offset,index_t length,
          on_reserved_value_supplier_t *reservedValueSupplier)

{
  bool bVar1;
  int32_t termCount_00;
  int iVar2;
  int32_t activeTermId;
  int64_t iVar3;
  pointer this_00;
  ulong rawTail_00;
  int64_t iVar4;
  long currentPosition;
  int32_t local_74;
  int32_t resultingOffset;
  int64_t position;
  int32_t termId;
  int64_t termOffset;
  int64_t rawTail;
  TermAppender *termAppender;
  int32_t termCount;
  int64_t limit;
  int64_t newPosition;
  on_reserved_value_supplier_t *reservedValueSupplier_local;
  index_t length_local;
  index_t offset_local;
  AtomicBuffer *buffer_local;
  Publication *this_local;
  
  limit = -4;
  bVar1 = isClosed(this);
  if (!bVar1) {
    iVar3 = concurrent::status::ReadablePosition<aeron::concurrent::status::UnsafeBufferPosition>::
            getVolatile(&this->m_publicationLimit);
    termCount_00 = concurrent::logbuffer::LogBufferDescriptor::activeTermCount
                             (this->m_logMetaDataBuffer);
    iVar2 = concurrent::logbuffer::LogBufferDescriptor::indexByTermCount((long)termCount_00);
    this_00 = std::
              unique_ptr<aeron::concurrent::logbuffer::TermAppender,_std::default_delete<aeron::concurrent::logbuffer::TermAppender>_>
              ::get(this->m_appenders + iVar2);
    rawTail_00 = concurrent::logbuffer::TermAppender::rawTailVolatile(this_00);
    activeTermId = concurrent::logbuffer::LogBufferDescriptor::termId(rawTail_00);
    iVar4 = concurrent::logbuffer::LogBufferDescriptor::computeTermBeginPosition
                      (activeTermId,this->m_positionBitsToShift,this->m_initialTermId);
    currentPosition = iVar4 + (rawTail_00 & 0xffffffff);
    if (termCount_00 != activeTermId - this->m_initialTermId) {
      return -3;
    }
    if (currentPosition < iVar3) {
      if (this->m_maxPayloadLength < length) {
        checkMaxMessageLength(this,length);
        local_74 = concurrent::logbuffer::TermAppender::appendFragmentedMessage
                             (this_00,&this->m_headerWriter,buffer,offset,length,
                              this->m_maxPayloadLength,reservedValueSupplier,activeTermId);
      }
      else {
        local_74 = concurrent::logbuffer::TermAppender::appendUnfragmentedMessage
                             (this_00,&this->m_headerWriter,buffer,offset,length,
                              reservedValueSupplier,activeTermId);
      }
      limit = Publication::newPosition
                        (this,termCount_00,(int32_t)rawTail_00,activeTermId,currentPosition,local_74
                        );
    }
    else {
      limit = backPressureStatus(this,currentPosition,length);
    }
  }
  return limit;
}

Assistant:

inline std::int64_t offer(
        const concurrent::AtomicBuffer& buffer,
        util::index_t offset,
        util::index_t length,
        const on_reserved_value_supplier_t& reservedValueSupplier)
    {
        std::int64_t newPosition = PUBLICATION_CLOSED;

        if (!isClosed())
        {
            const std::int64_t limit = m_publicationLimit.getVolatile();
            const std::int32_t termCount = LogBufferDescriptor::activeTermCount(m_logMetaDataBuffer);
            TermAppender *termAppender = m_appenders[LogBufferDescriptor::indexByTermCount(termCount)].get();
            const std::int64_t rawTail = termAppender->rawTailVolatile();
            const std::int64_t termOffset = rawTail & 0xFFFFFFFF;
            const std::int32_t termId = LogBufferDescriptor::termId(rawTail);
            const std::int64_t position = LogBufferDescriptor::computeTermBeginPosition(
                termId, m_positionBitsToShift, m_initialTermId) + termOffset;

            if (termCount != (termId - m_initialTermId))
            {
                return ADMIN_ACTION;
            }

            if (position < limit)
            {
                std::int32_t resultingOffset;
                if (length <= m_maxPayloadLength)
                {
                    resultingOffset = termAppender->appendUnfragmentedMessage(
                        m_headerWriter, buffer, offset, length, reservedValueSupplier, termId);
                }
                else
                {
                    checkMaxMessageLength(length);
                    resultingOffset = termAppender->appendFragmentedMessage(
                        m_headerWriter, buffer, offset, length, m_maxPayloadLength, reservedValueSupplier, termId);
                }

                newPosition = Publication::newPosition(
                    termCount, static_cast<std::int32_t>(termOffset), termId, position, resultingOffset);
            }
            else
            {
                newPosition = Publication::backPressureStatus(position, length);
            }
        }

        return newPosition;
    }